

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluVerify(word *pF,int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int nWords_1;
  ulong uVar5;
  word (*__src) [1024];
  int nWords;
  long lVar6;
  word *__dest;
  word (*f) [1024];
  word pTTRes [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word wStack_10040;
  word awStack_10038 [1024];
  word local_e038 [1024];
  word local_c038 [6145];
  
  bVar4 = g->nVars;
  wStack_10040 = BStruth;
  if (('\x06' < (char)bVar4) || ('\x06' < r->nVars)) {
    __assert_fail("g->nVars <= 6 && r->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x285,"void If_CluVerify(word *, int, If_Grp_t *, If_Grp_t *, word, word *)");
  }
  if (TruthAll[0][0] == 0) {
    If_CluInitTruthTables();
    bVar4 = g->nVars;
  }
  if ('\0' < (char)bVar4) {
    uVar2 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar2 = 1;
    }
    __dest = local_c038;
    uVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        memcpy(__dest,TruthAll + g->pVars[uVar5],(ulong)uVar2 * 8);
      }
      uVar5 = uVar5 + 1;
      __dest = __dest + 0x400;
    } while (bVar4 != uVar5);
  }
  f = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g,&wStack_10040,f,local_e038);
  cVar1 = r->nVars;
  bVar4 = (char)nVars - 6;
  if ((long)cVar1 < 1) {
    uVar2 = 1 << (bVar4 & 0x1f);
  }
  else {
    uVar2 = 1 << (bVar4 & 0x1f);
    uVar5 = 1;
    if (6 < nVars) {
      uVar5 = (ulong)uVar2;
    }
    lVar6 = 0;
    do {
      if (r->pVars[lVar6] == nVars) {
        __src = &local_e038;
        if (0 < (int)uVar5) {
LAB_00416dc2:
          memcpy(f,__src,uVar5 * 8);
        }
      }
      else if (0 < (int)uVar5) {
        __src = TruthAll + (int)r->pVars[lVar6];
        goto LAB_00416dc2;
      }
      lVar6 = lVar6 + 1;
      f = f + 1;
    } while (cVar1 != lVar6);
  }
  If_CluComposeLut(nVars,r,pFStruth,(word (*) [1024])local_c038,awStack_10038);
  uVar3 = 1;
  if (6 < nVars) {
    uVar3 = uVar2;
  }
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      if (awStack_10038[uVar5] != pF[uVar5]) {
        putchar(10);
        If_CluPrintConfig(nVars,g,r,BStruth,pFStruth);
        Kit_DsdPrintFromTruth((uint *)awStack_10038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)pF,nVars);
        putchar(10);
        puts("Verification FAILED!");
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void If_CluVerify( word * pF, int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, pFStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "\n" );
        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}